

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coba.cpp
# Opt level: O3

void fun1(int px,int py)

{
  bool bVar1;
  char cVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  
  uVar5 = 0;
  uVar6 = 100;
  do {
    iVar4 = py + uVar6;
    lVar3 = (long)(int)(py + uVar6 + -100) * -0x66666667;
    cVar2 = ((char)(uint)((ulong)lVar3 >> 0x21) - (char)(lVar3 >> 0x3f)) + -0x38;
    bVar8 = uVar6 - 100 < 0xb;
    uVar7 = 100;
    do {
      if (uVar7 - 0xa0 < 0xb && uVar6 < 0xa1) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar7 - 0xa0 < 0x29 && (uVar6 - 0x78 < 0xb || bVar8)) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if ((uVar6 < 0xa1 && uVar7 - 0xbe < 0xb) || (uVar7 < 0x97 && (uVar6 - 0x96 < 0xb || bVar8))) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (((int)(0x95 - uVar5) <= (int)uVar7) &&
         (((int)uVar7 <= (int)(0x9f - uVar5) && 0x6d < uVar6) && uVar5 < 0x31)) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar7 - 0xd2 < 0xb && uVar6 < 0xa1) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (((uVar5 + 0xd3 <= uVar7) && (uVar5 < 0x31)) && (uVar7 <= uVar5 + 0xdd)) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      bVar9 = uVar7 - 0x104 < 0xb;
      if ((bVar9 && uVar6 < 0xa1) || (uVar7 - 0x118 < 0xb && uVar6 < 0xa1)) {
        bVar9 = !bVar9 || uVar6 >= 0xa1;
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      else {
        bVar9 = false;
      }
      bVar10 = uVar5 + 0x119 <= uVar7;
      bVar1 = uVar7 <= uVar5 + 0x123;
      if ((bVar10 && uVar5 < 0x1d) && bVar1) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if ((((int)(0x153 - uVar5) <= (int)uVar7) && (0x81 < uVar6)) &&
         ((uVar5 < 0x3b && ((int)uVar7 <= (int)(0x15d - uVar5))))) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (bVar9) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if ((bVar10 && uVar5 < 0x1d) && bVar1) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (((((int)(0x153 - uVar5) <= (int)uVar7) && (0x81 < uVar6)) && (uVar5 < 0x3b)) &&
         ((int)uVar7 <= (int)(0x15d - uVar5))) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      if (uVar7 - 0x14a < 0xb && uVar6 < 0xa1) {
        FrameBuffer::set(0x1050a8,px + uVar7,iVar4,'\0','d',
                         (char)(((px + uVar7) - ((int)(px + uVar7 + -100) >> 0x1f)) - 100 >> 1) +
                         '\x0f',cVar2);
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 != 1000);
    uVar5 = uVar5 + 1;
    uVar6 = uVar6 + 1;
  } while (uVar5 != 900);
  return;
}

Assistant:

void fun1(int px, int py) {
	int i = 0, x, y;
  // Figure out where in memory to put the pixel
  for (y = 100; y < 1000; y++) {
	  i++;
    for (x = 100; x < 1000; x++) {
      if(x>=160&&x<=170&&y<=160){
				setWarna(px+x,py+y);
			}
			if(y>=100&&y<=110&&x>=160&&x<=200){
				setWarna(px+x,py+y);
			}
			if(y>=120&&y<=130&&x>=160&&x<=200){
				setWarna(px+x,py+y);
			}
			if(x>=190&&x<=200&y<=160){
				setWarna(px+x,py+y);
			}
			if(y>=100&&y<=110&&x<=150){
					setWarna(px+x,py+y);
				}
			if(y>=150&&y<=160&&x<=150){
					setWarna(px+x,py+y);
				}
			if(x>=150-i&&x<=160-i&&i<50&&y>=110){
				  setWarna(px+x,py+y);
			}
			if(x>=210&&x<=220&&y<=160){
                setWarna(px+x,py+y);
				}
				
				if(x>=210+i&&x<=220+i&&i<50){
                setWarna(px+x,py+y);
				}

				if(x>=260&&x<=270&y<=160){
                setWarna(px+x,py+y);
				}	
			if(x>=280&&x<=290&&y<=160){
                setWarna(px+x,py+y);
			}
			if(x>=280+i&&x<=290+i&&i<30){
                setWarna(px+x,py+y);
			}
			if(x>=310-(i-30)&&x<=320-(i-30)&&i<60&&y>=130){
                setWarna(px+x,py+y);
			}
			if(x>=280&&x<=290&&y<=160){
                setWarna(px+x,py+y);
			}
			if(x>=280+i&&x<=290+i&&i<30){
                setWarna(px+x,py+y);
			}
			if(x>=310-(i-30)&&x<=320-(i-30)&&i<60&&y>=130){
                setWarna(px+x,py+y);
			}
			if(x>=330&&x<=340&&y<=160){
                setWarna(px+x,py+y);
				}
    }
  }
}